

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O3

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanNot(UnicodeSetStringSpan *this,UChar *s,int32_t length)

{
  UChar *pUVar1;
  UChar UVar2;
  ushort uVar3;
  uint uVar4;
  char cVar5;
  int32_t iVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int32_t length_00;
  long lVar13;
  ulong uVar14;
  int iVar15;
  
  uVar4 = this->strings->count;
  iVar15 = 0;
  length_00 = length;
  do {
    iVar6 = UnicodeSet::span(this->pSpanNotSet,s + iVar15,length_00,USET_SPAN_NOT_CONTAINED);
    iVar12 = length_00 - iVar6;
    if (iVar12 == 0) {
      return length;
    }
    iVar15 = iVar6 + iVar15;
    pUVar1 = s + iVar15;
    UVar2 = *pUVar1;
    if (((iVar12 < 2) || (((ushort)UVar2 & 0xfc00) != 0xd800)) ||
       (((ushort)pUVar1[1] & 0xfc00) != 0xdc00)) {
      cVar5 = UnicodeSet::contains(&this->spanSet,(uint)(ushort)UVar2);
      iVar9 = -1;
    }
    else {
      cVar5 = UnicodeSet::contains
                        (&this->spanSet,
                         (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)pUVar1[1] + -0x35fdc00);
      iVar9 = -2;
    }
    if (cVar5 != '\0') {
      return iVar15;
    }
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        if (this->spanLengths[uVar14] != 0xff) {
          pvVar8 = UVector::elementAt(this->strings,(int32_t)uVar14);
          uVar3 = *(ushort *)((long)pvVar8 + 8);
          if ((uVar3 & 0x11) == 0) {
            if ((uVar3 & 2) == 0) {
              lVar10 = *(long *)((long)pvVar8 + 0x18);
            }
            else {
              lVar10 = (long)pvVar8 + 10;
            }
          }
          else {
            lVar10 = 0;
          }
          if ((short)uVar3 < 0) {
            iVar7 = *(int *)((long)pvVar8 + 0xc);
          }
          else {
            iVar7 = (int)(short)uVar3 >> 5;
          }
          if (iVar7 <= iVar12) {
            iVar11 = iVar7 + 1;
            lVar13 = 0;
            do {
              if (*(short *)((long)pUVar1 + lVar13) != *(short *)(lVar10 + lVar13))
              goto LAB_002ddc1f;
              lVar13 = lVar13 + 2;
              iVar11 = iVar11 + -1;
            } while (1 < iVar11);
            if (((iVar15 < 1) || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
               ((*pUVar1 & 0xfc00U) != 0xdc00)) {
              if (length - iVar15 <= iVar7) {
                return iVar15;
              }
              if ((pUVar1[(long)iVar7 + -1] & 0xfc00U) != 0xd800) {
                return iVar15;
              }
              if ((pUVar1[iVar7] & 0xfc00U) != 0xdc00) {
                return iVar15;
              }
            }
          }
        }
LAB_002ddc1f:
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar4);
    }
    iVar15 = iVar15 - iVar9;
    length_00 = iVar12 + iVar9;
    if (length_00 == 0) {
      return length;
    }
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::spanNot(const UChar *s, int32_t length) const {
    int32_t pos=0, rest=length;
    int32_t i, stringsLength=strings.size();
    do {
        // Span until we find a code point from the set,
        // or a code point that starts or ends some string.
        i=pSpanNotSet->span(s+pos, rest, USET_SPAN_NOT_CONTAINED);
        if(i==rest) {
            return length;  // Reached the end of the string.
        }
        pos+=i;
        rest-=i;

        // Check whether the current code point is in the original set,
        // without the string starts and ends.
        int32_t cpLength=spanOne(spanSet, s+pos, rest);
        if(cpLength>0) {
            return pos;  // There is a set element at pos.
        }

        // Try to match the strings at pos.
        for(i=0; i<stringsLength; ++i) {
            if(spanLengths[i]==ALL_CP_CONTAINED) {
                continue;  // Irrelevant string.
            }
            const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
            const UChar *s16=string.getBuffer();
            int32_t length16=string.length();
            if(length16<=rest && matches16CPB(s, pos, length, s16, length16)) {
                return pos;  // There is a set element at pos.
            }
        }

        // The span(while not contained) ended on a string start/end which is
        // not in the original set. Skip this code point and continue.
        // cpLength<0
        pos-=cpLength;
        rest+=cpLength;
    } while(rest!=0);
    return length;  // Reached the end of the string.
}